

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ym3438.c
# Opt level: O0

void NOPN2_Clock(ym3438_t *chip,Bit32s *buffer)

{
  Bit32u BVar1;
  Bit32u slot;
  Bit32s *buffer_local;
  ym3438_t *chip_local;
  
  BVar1 = chip->cycles;
  chip->lfo_inc = chip->mode_test_21[1];
  chip->pg_read = chip->pg_read >> 1;
  chip->eg_read[1] = chip->eg_read[1] >> 1;
  chip->eg_cycle = chip->eg_cycle + '\x01';
  if ((chip->cycles == 1) && (chip->eg_quotient == 2)) {
    if (chip->eg_cycle_stop == '\0') {
      chip->eg_shift_lock = chip->eg_shift + '\x01';
    }
    else {
      chip->eg_shift_lock = '\0';
    }
    chip->eg_timer_low_lock = (byte)chip->eg_timer & 3;
  }
  switch(chip->cycles) {
  case 0:
    chip->lfo_pm = (Bit8u)((int)(uint)chip->lfo_cnt >> 2);
    if ((chip->lfo_cnt & 0x40) == 0) {
      chip->lfo_am = chip->lfo_cnt ^ 0x3f;
    }
    else {
      chip->lfo_am = chip->lfo_cnt & 0x3f;
    }
    chip->lfo_am = chip->lfo_am << 1;
    break;
  case 1:
    chip->eg_quotient = chip->eg_quotient + 1;
    chip->eg_quotient = chip->eg_quotient % 3;
    chip->eg_cycle = '\0';
    chip->eg_cycle_stop = '\x01';
    chip->eg_shift = '\0';
    chip->eg_timer_inc = chip->eg_timer_inc | (byte)((int)(uint)chip->eg_quotient >> 1);
    chip->eg_timer = chip->eg_timer + (ushort)chip->eg_timer_inc;
    chip->eg_timer_inc = (Bit8u)((int)(uint)chip->eg_timer >> 0xc);
    chip->eg_timer = chip->eg_timer & 0xfff;
    break;
  case 2:
    chip->pg_read = chip->pg_phase[0x15] & 0x3ff;
    chip->eg_read[1] = (uint)chip->eg_out[0];
    break;
  case 0xd:
    chip->eg_cycle = '\0';
    chip->eg_cycle_stop = '\x01';
    chip->eg_shift = '\0';
    chip->eg_timer = chip->eg_timer + (ushort)chip->eg_timer_inc;
    chip->eg_timer_inc = (Bit8u)((int)(uint)chip->eg_timer >> 0xc);
    chip->eg_timer = chip->eg_timer & 0xfff;
    break;
  case 0x17:
    chip->lfo_inc = chip->lfo_inc | 1;
  }
  chip->eg_timer =
       chip->eg_timer & ((ushort)chip->mode_test_21[5] << (chip->eg_cycle & 0x1f) ^ 0xffff);
  if ((((int)(uint)chip->eg_timer >> (chip->eg_cycle & 0x1f) |
       (uint)(chip->pin_test_in & chip->eg_custom_timer)) & (uint)chip->eg_cycle_stop) != 0) {
    chip->eg_shift = chip->eg_cycle;
    chip->eg_cycle_stop = '\0';
  }
  NOPN2_DoIO(chip);
  NOPN2_DoTimerA(chip);
  NOPN2_DoTimerB(chip);
  NOPN2_KeyOn(chip);
  NOPN2_ChOutput(chip);
  NOPN2_ChGenerate(chip);
  NOPN2_FMPrepare(chip);
  NOPN2_FMGenerate(chip);
  NOPN2_PhaseGenerate(chip);
  NOPN2_PhaseCalcIncrement(chip);
  NOPN2_EnvelopeADSR(chip);
  NOPN2_EnvelopeGenerate(chip);
  NOPN2_EnvelopeSSGEG(chip);
  NOPN2_EnvelopePrepare(chip);
  if (chip->mode_ch3 == '\0') {
    chip->pg_fnum = chip->fnum[(ulong)(chip->channel + 1) % 6];
    chip->pg_block = chip->block[(ulong)(chip->channel + 1) % 6];
    chip->pg_kcode = chip->kcode[(ulong)(chip->channel + 1) % 6];
  }
  else {
    switch(BVar1) {
    case 1:
      chip->pg_fnum = chip->fnum_3ch[1];
      chip->pg_block = chip->block_3ch[1];
      chip->pg_kcode = chip->kcode_3ch[1];
      break;
    case 7:
      chip->pg_fnum = chip->fnum_3ch[0];
      chip->pg_block = chip->block_3ch[0];
      chip->pg_kcode = chip->kcode_3ch[0];
      break;
    case 0xd:
      chip->pg_fnum = chip->fnum_3ch[2];
      chip->pg_block = chip->block_3ch[2];
      chip->pg_kcode = chip->kcode_3ch[2];
      break;
    case 0x13:
    default:
      chip->pg_fnum = chip->fnum[(ulong)(chip->channel + 1) % 6];
      chip->pg_block = chip->block[(ulong)(chip->channel + 1) % 6];
      chip->pg_kcode = chip->kcode[(ulong)(chip->channel + 1) % 6];
    }
  }
  NOPN2_UpdateLFO(chip);
  NOPN2_DoRegWrite(chip);
  chip->cycles = (chip->cycles + 1) % 0x18;
  chip->channel = chip->cycles % 6;
  *buffer = (int)chip->mol;
  buffer[1] = (int)chip->mor;
  if (chip->status_time != 0) {
    chip->status_time = chip->status_time - 1;
  }
  return;
}

Assistant:

void NOPN2_Clock(ym3438_t *chip, Bit32s *buffer)
{
    Bit32u slot = chip->cycles;
    chip->lfo_inc = chip->mode_test_21[1];
    chip->pg_read >>= 1;
    chip->eg_read[1] >>= 1;
    chip->eg_cycle++;
    /* Lock envelope generator timer value */
    if (chip->cycles == 1 && chip->eg_quotient == 2)
    {
        if (chip->eg_cycle_stop)
        {
            chip->eg_shift_lock = 0;
        }
        else
        {
            chip->eg_shift_lock = chip->eg_shift + 1;
        }
        chip->eg_timer_low_lock = chip->eg_timer & 0x03;
    }
    /* Cycle specific functions */
    switch (chip->cycles)
    {
    case 0:
        chip->lfo_pm = chip->lfo_cnt >> 2;
        if (chip->lfo_cnt & 0x40)
        {
            chip->lfo_am = chip->lfo_cnt & 0x3f;
        }
        else
        {
            chip->lfo_am = chip->lfo_cnt ^ 0x3f;
        }
        chip->lfo_am <<= 1;
        break;
    case 1:
        chip->eg_quotient++;
        chip->eg_quotient %= 3;
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer_inc |= chip->eg_quotient >> 1;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 2:
        chip->pg_read = chip->pg_phase[21] & 0x3ff;
        chip->eg_read[1] = chip->eg_out[0];
        break;
    case 13:
        chip->eg_cycle = 0;
        chip->eg_cycle_stop = 1;
        chip->eg_shift = 0;
        chip->eg_timer = chip->eg_timer + chip->eg_timer_inc;
        chip->eg_timer_inc = chip->eg_timer >> 12;
        chip->eg_timer &= 0xfff;
        break;
    case 23:
        chip->lfo_inc |= 1;
        break;
    }
    chip->eg_timer &= ~(chip->mode_test_21[5] << chip->eg_cycle);
    if (((chip->eg_timer >> chip->eg_cycle) | (chip->pin_test_in & chip->eg_custom_timer)) & chip->eg_cycle_stop)
    {
        chip->eg_shift = chip->eg_cycle;
        chip->eg_cycle_stop = 0;
    }

    NOPN2_DoIO(chip);

    NOPN2_DoTimerA(chip);
    NOPN2_DoTimerB(chip);
    NOPN2_KeyOn(chip);

    NOPN2_ChOutput(chip);
    NOPN2_ChGenerate(chip);

    NOPN2_FMPrepare(chip);
    NOPN2_FMGenerate(chip);

    NOPN2_PhaseGenerate(chip);
    NOPN2_PhaseCalcIncrement(chip);

    NOPN2_EnvelopeADSR(chip);
    NOPN2_EnvelopeGenerate(chip);
    NOPN2_EnvelopeSSGEG(chip);
    NOPN2_EnvelopePrepare(chip);

    /* Prepare fnum & block */
    if (chip->mode_ch3)
    {
        /* Channel 3 special mode */
        switch (slot)
        {
        case 1: /* OP1 */
            chip->pg_fnum = chip->fnum_3ch[1];
            chip->pg_block = chip->block_3ch[1];
            chip->pg_kcode = chip->kcode_3ch[1];
            break;
        case 7: /* OP3 */
            chip->pg_fnum = chip->fnum_3ch[0];
            chip->pg_block = chip->block_3ch[0];
            chip->pg_kcode = chip->kcode_3ch[0];
            break;
        case 13: /* OP2 */
            chip->pg_fnum = chip->fnum_3ch[2];
            chip->pg_block = chip->block_3ch[2];
            chip->pg_kcode = chip->kcode_3ch[2];
            break;
        case 19: /* OP4 */
        default:
            chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
            chip->pg_block = chip->block[(chip->channel + 1) % 6];
            chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
            break;
        }
    }
    else
    {
        chip->pg_fnum = chip->fnum[(chip->channel + 1) % 6];
        chip->pg_block = chip->block[(chip->channel + 1) % 6];
        chip->pg_kcode = chip->kcode[(chip->channel + 1) % 6];
    }

    NOPN2_UpdateLFO(chip);
    NOPN2_DoRegWrite(chip);
    chip->cycles = (chip->cycles + 1) % 24;
    chip->channel = chip->cycles % 6;

    buffer[0] = chip->mol;
    buffer[1] = chip->mor;

    if (chip->status_time)
        chip->status_time--;
}